

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

Aig_Man_t *
LivenessToSafetyTransformationAbs
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Int_t *vFlops,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair
          ,Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint i_00;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *p0;
  Abc_Obj_t *pAVar11;
  char *pcVar12;
  Aig_Obj_t *pAVar13;
  int local_124;
  int local_120;
  int fairLatch;
  int liveLatch;
  int loCreated;
  int liCreated;
  int loCopied;
  int liCopied;
  int piCopied;
  char *nodeName;
  Aig_Obj_t *collectiveAssumeSafety;
  Aig_Obj_t *collectiveAssertSafety;
  Aig_Obj_t *pArgument;
  Aig_Obj_t *pDriverImage;
  Aig_Obj_t *pObjSafetyPropertyOutput;
  Aig_Obj_t *pObjSafetyGate;
  Aig_Obj_t *pObjFair;
  Aig_Obj_t *pObjLive;
  Aig_Obj_t *pObjAndAcc;
  Aig_Obj_t *pObjXnor;
  Aig_Obj_t *pObjXor;
  Aig_Obj_t *pObjShadowLiDriver;
  Aig_Obj_t *pObjShadowLi;
  Aig_Obj_t *pObjShadowLo;
  Aig_Obj_t *pObjSaveAndNotSaved;
  Aig_Obj_t *pObjSaveOrSaved;
  Aig_Obj_t *pObjSavedLoAndEquality;
  Aig_Obj_t *pMatch;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObjSavedLo;
  Aig_Obj_t *pObjSavedLi;
  Aig_Obj_t *pObjSavePi;
  int local_48;
  int iEntry;
  int nRegCount;
  int i;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vFair_local;
  Vec_Ptr_t *vLive_local;
  Vec_Int_t *vFlops_local;
  Aig_Man_t *p_local;
  Abc_Ntk_t *pNtk_local;
  int mode_local;
  
  pObjSavedLi = (Aig_Obj_t *)0x0;
  pObjSavedLo = (Aig_Obj_t *)0x0;
  pObj = (Aig_Obj_t *)0x0;
  pObjSaveAndNotSaved = (Aig_Obj_t *)0x0;
  pObjShadowLo = (Aig_Obj_t *)0x0;
  pDriverImage = (Aig_Obj_t *)0x0;
  local_120 = 0;
  local_124 = 0;
  iVar2 = Saig_ManPiNum(p);
  vecPis = Vec_PtrAlloc(iVar2 + 1);
  iVar2 = Saig_ManPiNum(p);
  vecPiNames = Vec_PtrAlloc(iVar2 + 1);
  iVar2 = Saig_ManRegNum(p);
  iVar3 = Vec_IntSize(vFlops);
  iVar4 = Vec_PtrSize(vLive);
  iVar5 = Vec_PtrSize(vFair);
  vecLos = Vec_PtrAlloc(iVar2 + iVar3 + 1 + iVar4 + iVar5);
  iVar2 = Saig_ManRegNum(p);
  iVar3 = Vec_IntSize(vFlops);
  iVar4 = Vec_PtrSize(vLive);
  iVar5 = Vec_PtrSize(vFair);
  vecLoNames = Vec_PtrAlloc(iVar2 + iVar3 + 1 + iVar4 + iVar5);
  iVar2 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar2 << 1);
  sVar6 = strlen(pNtk->pName);
  pcVar7 = (char *)malloc(sVar6 + 5);
  p_00->pName = pcVar7;
  sprintf(p_00->pName,"%s_%s",pNtk->pName,"l2s");
  p_00->pSpec = (char *)0x0;
  pMatch = Aig_ManConst1(p);
  pAVar8 = Aig_ManConst1(p_00);
  (pMatch->field_5).pData = pAVar8;
  for (iEntry = 0; iVar2 = Saig_ManPiNum(p), iEntry < iVar2; iEntry = iEntry + 1) {
    pMatch = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iEntry);
    pAVar8 = Aig_ObjCreateCi(p_00);
    (pMatch->field_5).pData = pAVar8;
    Vec_PtrPush(vecPis,(pMatch->field_5).pData);
    pAVar11 = Abc_NtkPi(pNtk,iEntry);
    pcVar7 = Abc_ObjName(pAVar11);
    pcVar7 = Abc_UtilStrsav(pcVar7);
    Vec_PtrPush(vecPiNames,pcVar7);
  }
  if ((mode == 0) || (mode == 2)) {
    pObjSavedLi = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecPiNames,"SAVE_BIERE");
  }
  for (iEntry = 0; iVar2 = Saig_ManRegNum(p), iEntry < iVar2; iEntry = iEntry + 1) {
    pVVar1 = p->vCis;
    iVar2 = Saig_ManPiNum(p);
    pMatch = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iEntry + iVar2);
    pAVar8 = Aig_ObjCreateCi(p_00);
    (pMatch->field_5).pData = pAVar8;
    Vec_PtrPush(vecLos,(pMatch->field_5).pData);
    iVar2 = Abc_NtkPiNum(pNtk);
    pAVar11 = Abc_NtkCi(pNtk,iVar2 + iEntry);
    pcVar7 = Abc_ObjName(pAVar11);
    pcVar7 = Abc_UtilStrsav(pcVar7);
    Vec_PtrPush(vecLoNames,pcVar7);
  }
  if ((mode == 0) || (mode == 2)) {
    pObj = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecLos,pObj);
    Vec_PtrPush(vecLoNames,"SAVED_LO");
  }
  if ((mode == 0) || (mode == 2)) {
    pObjSaveAndNotSaved = Aig_Or(p_00,pObjSavedLi,pObj);
    pAVar8 = Aig_Not(pObj);
    pObjShadowLo = Aig_And(p_00,pObjSavedLi,pAVar8);
  }
  for (iEntry = 0; iVar2 = Vec_PtrSize(p->vObjs), iEntry < iVar2; iEntry = iEntry + 1) {
    pMatch = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iEntry);
    if ((pMatch != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pMatch), iVar2 != 0)) {
      pAVar8 = Aig_ObjChild0Copy(pMatch);
      pAVar13 = Aig_ObjChild1Copy(pMatch);
      pAVar8 = Aig_And(p_00,pAVar8,pAVar13);
      (pMatch->field_5).pData = pAVar8;
    }
  }
  if ((mode == 0) || (mode == 1)) {
    iVar2 = Vec_PtrSize(vAssertSafety);
    if ((iVar2 == 0) || (iVar2 = Vec_PtrSize(vAssumeSafety), iVar2 != 0)) {
      iVar2 = Vec_PtrSize(vAssertSafety);
      if ((iVar2 == 0) || (iVar2 = Vec_PtrSize(vAssumeSafety), iVar2 == 0)) {
        printf(
              "WARNING!! No safety property is found, a new (negated) constant 1 output is created\n"
              );
        pAVar8 = Aig_ManConst1(p_00);
        pAVar8 = Aig_Not(pAVar8);
        Aig_ObjCreateCo(p_00,pAVar8);
      }
      else {
        pObjLive = Aig_ManConst1(p_00);
        for (iEntry = 0; pAVar8 = pObjLive, iVar2 = Vec_PtrSize(vAssertSafety), iEntry < iVar2;
            iEntry = iEntry + 1) {
          pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iEntry);
          pAVar8 = Aig_ObjFanin0(pMatch);
          pAVar8 = (Aig_Obj_t *)(pAVar8->field_5).pData;
          iVar2 = Aig_ObjFaninC0(pMatch);
          pAVar8 = Aig_NotCond(pAVar8,iVar2);
          pObjLive = Aig_And(p_00,pAVar8,pObjLive);
        }
        pObjLive = Aig_ManConst1(p_00);
        for (iEntry = 0; iVar2 = Vec_PtrSize(vAssumeSafety), iEntry < iVar2; iEntry = iEntry + 1) {
          pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssumeSafety,iEntry);
          pAVar13 = Aig_ObjFanin0(pMatch);
          pAVar13 = (Aig_Obj_t *)(pAVar13->field_5).pData;
          iVar2 = Aig_ObjFaninC0(pMatch);
          pAVar13 = Aig_NotCond(pAVar13,iVar2);
          pObjLive = Aig_And(p_00,pAVar13,pObjLive);
        }
        pAVar8 = Aig_Not(pAVar8);
        pAVar8 = Aig_And(p_00,pAVar8,pObjLive);
        Aig_ObjCreateCo(p_00,pAVar8);
      }
    }
    else {
      pObjLive = Aig_ManConst1(p_00);
      for (iEntry = 0; iVar2 = Vec_PtrSize(vAssertSafety), iEntry < iVar2; iEntry = iEntry + 1) {
        pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iEntry);
        pAVar8 = Aig_ObjFanin0(pMatch);
        pAVar8 = (Aig_Obj_t *)(pAVar8->field_5).pData;
        iVar2 = Aig_ObjFaninC0(pMatch);
        pAVar8 = Aig_NotCond(pAVar8,iVar2);
        pObjLive = Aig_And(p_00,pAVar8,pObjLive);
      }
      pAVar8 = Aig_Not(pObjLive);
      Aig_ObjCreateCo(p_00,pAVar8);
    }
  }
  if ((mode == 0) || (mode == 2)) {
    pAVar8 = Aig_ObjFanin0(pMatch);
    pDriverImage = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(pAVar8->field_5).pData);
  }
  local_48 = 0;
  for (iEntry = 0; iVar2 = Saig_ManRegNum(p), iEntry < iVar2; iEntry = iEntry + 1) {
    pVVar1 = p->vCis;
    iVar2 = Saig_ManPiNum(p);
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iEntry + iVar2);
    pAVar13 = Saig_ObjLoToLi(p,pAVar8);
    pAVar8 = Aig_ObjFanin0(pAVar13);
    pAVar8 = (Aig_Obj_t *)(pAVar8->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar13);
    pAVar8 = Aig_NotCond(pAVar8,iVar2);
    Aig_ObjCreateCo(p_00,pAVar8);
    local_48 = local_48 + 1;
  }
  if ((mode == 0) || (mode == 2)) {
    pObjSavedLo = Aig_ObjCreateCo(p_00,pObjSaveAndNotSaved);
    pObjLive = Aig_ManConst1(p_00);
    for (iEntry = 0; iVar2 = Saig_ManRegNum(p), iEntry < iVar2; iEntry = iEntry + 1) {
      pVVar1 = p->vCis;
      iVar2 = Saig_ManPiNum(p);
      Vec_PtrEntry(pVVar1,iEntry + iVar2);
      iVar2 = Abc_NtkPiNum(pNtk);
      pAVar11 = Abc_NtkCi(pNtk,iVar2 + iEntry);
      pcVar7 = Abc_ObjName(pAVar11);
      printf("Flop[%d] = %s\n",(ulong)(uint)iEntry,pcVar7);
    }
    iEntry = 0;
    while( true ) {
      local_48 = local_48 + 1;
      iVar2 = Vec_IntSize(vFlops);
      if (iVar2 <= iEntry) break;
      i_00 = Vec_IntEntry(vFlops,iEntry);
      pAVar8 = Aig_ObjCreateCi(p_00);
      pAVar13 = Aig_ManLo(p,i_00);
      Vec_PtrPush(vecLos,pAVar8);
      iVar2 = Abc_NtkPiNum(pNtk);
      pAVar11 = Abc_NtkCi(pNtk,iVar2 + i_00);
      pcVar7 = Abc_ObjName(pAVar11);
      sVar6 = strlen(pcVar7);
      pcVar7 = (char *)malloc(sVar6 + 10);
      iVar2 = Abc_NtkPiNum(pNtk);
      pAVar11 = Abc_NtkCi(pNtk,iVar2 + i_00);
      pcVar12 = Abc_ObjName(pAVar11);
      sprintf(pcVar7,"%s__%s",pcVar12,"SHADOW");
      printf("Flop copied [%d] = %s\n",(ulong)i_00,pcVar7);
      Vec_PtrPush(vecLoNames,pcVar7);
      pAVar10 = Aig_Mux(p_00,pObjShadowLo,(Aig_Obj_t *)(pAVar13->field_5).pData,pAVar8);
      Aig_ObjCreateCo(p_00,pAVar10);
      pAVar8 = Aig_Exor(p_00,(Aig_Obj_t *)(pAVar13->field_5).pData,pAVar8);
      pAVar8 = Aig_Not(pAVar8);
      pObjLive = Aig_And(p_00,pAVar8,pObjLive);
      iEntry = iEntry + 1;
    }
    pAVar8 = Aig_And(p_00,pObj,pObjLive);
    pObjLive = Aig_ManConst1(p_00);
    if ((vLive == (Vec_Ptr_t *)0x0) || (iVar2 = Vec_PtrSize(vLive), iVar2 == 0)) {
      printf("Circuit without any liveness property\n");
    }
    else {
      for (iEntry = 0; iVar2 = Vec_PtrSize(vLive), iEntry < iVar2; iEntry = iEntry + 1) {
        pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(vLive,iEntry);
        local_120 = local_120 + 1;
        pAVar13 = Aig_ObjChild0(pAVar10);
        pAVar13 = Aig_Regular(pAVar13);
        pAVar13 = (Aig_Obj_t *)(pAVar13->field_5).pData;
        iVar2 = Aig_ObjFaninC0(pAVar10);
        pAVar13 = Aig_NotCond(pAVar13,iVar2);
        pAVar9 = Aig_ObjCreateCi(p_00);
        Vec_PtrPush(vecLos,pAVar9);
        iVar2 = getPoIndex(p,pAVar10);
        pAVar11 = Abc_NtkPo(pNtk,iVar2);
        pcVar7 = Abc_ObjName(pAVar11);
        sVar6 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar6 + 0xc);
        iVar2 = getPoIndex(p,pAVar10);
        pAVar11 = Abc_NtkPo(pNtk,iVar2);
        pcVar12 = Abc_ObjName(pAVar11);
        sprintf(pcVar7,"%s__%s",pcVar12,"LIVENESS");
        Vec_PtrPush(vecLoNames,pcVar7);
        pAVar13 = Aig_And(p_00,pAVar13,pObjSaveAndNotSaved);
        pAVar13 = Aig_Or(p_00,pAVar9,pAVar13);
        Aig_ObjCreateCo(p_00,pAVar13);
        local_48 = local_48 + 1;
        pObjLive = Aig_And(p_00,pAVar9,pObjLive);
      }
    }
    pAVar13 = pObjLive;
    pObjLive = Aig_ManConst1(p_00);
    if ((vFair == (Vec_Ptr_t *)0x0) || (iVar2 = Vec_PtrSize(vFair), iVar2 == 0)) {
      printf("Circuit without any fairness property\n");
    }
    else {
      for (iEntry = 0; iVar2 = Vec_PtrSize(vFair), iEntry < iVar2; iEntry = iEntry + 1) {
        pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(vFair,iEntry);
        local_124 = local_124 + 1;
        pAVar10 = Aig_ObjChild0(pAVar9);
        pAVar10 = Aig_Regular(pAVar10);
        pAVar10 = (Aig_Obj_t *)(pAVar10->field_5).pData;
        iVar2 = Aig_ObjFaninC0(pAVar9);
        pAVar10 = Aig_NotCond(pAVar10,iVar2);
        p0 = Aig_ObjCreateCi(p_00);
        Vec_PtrPush(vecLos,p0);
        iVar2 = getPoIndex(p,pAVar9);
        pAVar11 = Abc_NtkPo(pNtk,iVar2);
        pcVar7 = Abc_ObjName(pAVar11);
        sVar6 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar6 + 0xc);
        iVar2 = getPoIndex(p,pAVar9);
        pAVar11 = Abc_NtkPo(pNtk,iVar2);
        pcVar12 = Abc_ObjName(pAVar11);
        sprintf(pcVar7,"%s__%s",pcVar12,"FAIRNESS");
        Vec_PtrPush(vecLoNames,pcVar7);
        pAVar10 = Aig_And(p_00,pAVar10,pObjSaveAndNotSaved);
        pAVar10 = Aig_Or(p_00,p0,pAVar10);
        Aig_ObjCreateCo(p_00,pAVar10);
        local_48 = local_48 + 1;
        pObjLive = Aig_And(p_00,p0,pObjLive);
      }
    }
    pAVar13 = Aig_Not(pAVar13);
    pAVar13 = Aig_And(p_00,pObjLive,pAVar13);
    pAVar8 = Aig_And(p_00,pAVar8,pAVar13);
    Aig_ObjPatchFanin0(p_00,pDriverImage,pAVar8);
  }
  Aig_ManSetRegNum(p_00,local_48);
  Aig_ManCiCleanupBiere(p_00);
  Aig_ManCoCleanupBiere(p_00);
  Aig_ManCleanup(p_00);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x33d,
                  "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((mode == 0) || (mode == 2)) {
    pVVar1 = p_00->vCos;
    iVar2 = Saig_ManPoNum(p_00);
    iVar3 = Aig_ObjCioId(pObj);
    iVar4 = Saig_ManPiNum(p);
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,((iVar2 + iVar3) - iVar4) + -1);
    if (pAVar8 != pObjSavedLo) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x341,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    iVar2 = Saig_ManPiNum(p);
    iVar3 = Saig_ManPiNum(p_00);
    if (iVar2 + 1 != iVar3) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x342,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    iVar2 = Saig_ManRegNum(p_00);
    iVar3 = Saig_ManRegNum(p);
    iVar4 = Vec_IntSize(vFlops);
    if (iVar2 != iVar3 + iVar4 + 1 + local_120 + local_124) {
      __assert_fail("Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + liveLatch + fairLatch"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x343,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return p_00;
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationAbs( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, Vec_Int_t *vFlops, 
                                           Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
    Aig_Man_t * pNew;
    int i, nRegCount, iEntry;
    Aig_Obj_t * pObjSavePi = NULL;
    Aig_Obj_t *pObjSavedLi = NULL, *pObjSavedLo = NULL;
    Aig_Obj_t *pObj, *pMatch;
    Aig_Obj_t *pObjSavedLoAndEquality, *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL;
    Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
    Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
    Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
    Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
    Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
    char *nodeName;
    int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0, fairLatch = 0;//, piVecIndex = 0;
    
    vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
    vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

    vecLos = Vec_PtrAlloc( Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
    vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

    //****************************************************************
    // Step1: create the new manager
    // Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
    // nodes, but this selection is arbitrary - need to be justified
    //****************************************************************
    pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
    pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l2s") + 1 );
    sprintf(pNew->pName, "%s_%s", pNtk->pName, "l2s");
    pNew->pSpec = NULL;
    
    //****************************************************************
    // Step 2: map constant nodes
    //****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

    //****************************************************************
    // Step 3: create true PIs
    //****************************************************************
    Saig_ManForEachPi( p, pObj, i )
    {
        piCopied++;
        pObj->pData = Aig_ObjCreateCi(pNew);
        Vec_PtrPush( vecPis, pObj->pData );
        nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
        Vec_PtrPush( vecPiNames, nodeName );
    }

    //****************************************************************
    // Step 4: create the special Pi corresponding to SAVE
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSavePi = Aig_ObjCreateCi( pNew );
        nodeName = "SAVE_BIERE",
        Vec_PtrPush( vecPiNames, nodeName );
    }
        
    //****************************************************************
    // Step 5: create register outputs
    //****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
        loCopied++;
        pObj->pData = Aig_ObjCreateCi(pNew);
        Vec_PtrPush( vecLos, pObj->pData );
        nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
        Vec_PtrPush( vecLoNames, nodeName );
    }

    //****************************************************************
    // Step 6: create "saved" register output
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        loCreated++;
        pObjSavedLo = Aig_ObjCreateCi( pNew );
        Vec_PtrPush( vecLos, pObjSavedLo );
        nodeName = "SAVED_LO";
        Vec_PtrPush( vecLoNames, nodeName );
    }

    //****************************************************************
    // Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
        pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
    }

    //********************************************************************
    // Step 8: create internal nodes
    //********************************************************************
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }

    
    //********************************************************************
    // Step 8.x : create PO for each safety assertions
    // NOTE : Here the output is purposely inverted as it will be thrown to 
    // dprove
    //********************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
    {
        if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
        {
            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
        }
        else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
        {
            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            collectiveAssertSafety = pObjAndAcc;

            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            collectiveAssumeSafety = pObjAndAcc;
            Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
        }
        else
        {
            printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
            Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
        }
    }

    //********************************************************************
    // Step 9: create the safety property output gate for the liveness properties
    // discuss with Sat/Alan for an alternative implementation
    //********************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
    }

    // create register inputs for the original registers
    nRegCount = 0;
    
    Saig_ManForEachLo( p, pObj, i )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
        liCopied++;
    }

    // create register input corresponding to the register "saved"
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        #ifndef DUPLICATE_CKT_DEBUG
            pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
            nRegCount++;
            liCreated++;

            //Changed on October 13, 2009
            //pObjAndAcc = NULL;
            pObjAndAcc = Aig_ManConst1( pNew );

    // create the family of shadow registers, then create the cascade of Xnor and And gates for the comparator 
            //Saig_ManForEachLo( p, pObj, i )
            Saig_ManForEachLo( p, pObj, i )
            {
                printf("Flop[%d] = %s\n", i, Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) );
            }
            Vec_IntForEachEntry( vFlops, iEntry, i )
            {
                pObjShadowLo = Aig_ObjCreateCi( pNew );
                pObj = Aig_ManLo( p, iEntry );

                #ifdef PROPAGATE_NAMES
                    Vec_PtrPush( vecLos, pObjShadowLo );
                    nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + iEntry ) ) ) + 10 );
                    sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + iEntry ) ), "SHADOW" );
                    printf("Flop copied [%d] = %s\n", iEntry, nodeName );
                    Vec_PtrPush( vecLoNames, nodeName );
                #endif

                pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                nRegCount++;
                loCreated++; liCreated++;
        
                pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                pObjXnor = Aig_Not( pObjXor );
                
                pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
            }

            // create the AND gate whose output will be the signal "looped"
            pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

            // create the master AND gate and corresponding AND and OR logic for the liveness properties
            pObjAndAcc = Aig_ManConst1( pNew );
            if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
            {
                printf("Circuit without any liveness property\n");
            }
            else
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
                {
                    liveLatch++;
                    pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
                    pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                    pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                    pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                    nRegCount++;
                    loCreated++; liCreated++;
            
                    pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
                }
            }

            pObjLive = pObjAndAcc;
                
            pObjAndAcc = Aig_ManConst1( pNew );
            if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
                printf("Circuit without any fairness property\n");
            else
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
                {
                    fairLatch++;
                    pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
                    pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "FAIRNESS" );
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                    pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                    pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                    nRegCount++;
                    loCreated++; liCreated++;
            
                    pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
                }
            }

            pObjFair = pObjAndAcc;
                
            //pObjSafetyGate = Aig_Exor( pNew, Aig_Not(Aig_ManConst1( pNew )), Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) ) );
            //Following is the actual Biere translation
            pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );

            Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
        #endif
    }

    Aig_ManSetRegNum( pNew, nRegCount );

    Aig_ManCiCleanupBiere( pNew );
    Aig_ManCoCleanupBiere( pNew );
    
    Aig_ManCleanup( pNew );
    
    assert( Aig_ManCheck( pNew ) );
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
            assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
            assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
            assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + liveLatch + fairLatch );
    }

    return pNew;
}